

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::Initialize
          (ChLinkMateGeneric *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> *mnorm1,ChVector<double> *mnorm2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  element_type *peVar10;
  element_type *peVar11;
  ChBodyFrame *pCVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double dVar121;
  ChMatrix33<double> mrot;
  undefined1 local_238 [16];
  double local_1a0;
  double local_198;
  double dStack_190;
  ChMatrix33<double> local_188;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  undefined1 auVar72 [16];
  
  peVar10 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar11 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar10 == peVar11) {
    __assert_fail("mbody1.get() != mbody2.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMate.cpp"
                  ,0x108,
                  "virtual void chrono::ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame>, std::shared_ptr<ChBodyFrame>, bool, ChVector<>, ChVector<>, ChVector<>, ChVector<>)"
                 );
  }
  (this->super_ChLinkMate).super_ChLink.Body1 = peVar10;
  (this->super_ChLinkMate).super_ChLink.Body2 = peVar11;
  iVar28 = (*(peVar10->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar29 = (*(((this->super_ChLinkMate).super_ChLink.Body2)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChLinkMask::SetTwoBodiesVariables
            (&this->mask,(ChVariables *)CONCAT44(extraout_var,iVar28),
             (ChVariables *)CONCAT44(extraout_var_00,iVar29));
  local_140._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.pos.m_data[2] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_140);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_140._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.pos.m_data[2] = 0.0;
  local_140.coord.rot.m_data[0] = 1.0;
  local_140.coord.rot.m_data[1] = 0.0;
  local_140.coord.rot.m_data[2] = 0.0;
  local_140.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_140.Amatrix,(ChQuaternion<double> *)&local_188);
  dVar68 = DAT_00b90b10;
  dVar84 = DAT_00b90b08;
  dVar95 = VECT_Z;
  if (!pos_are_relative) {
    local_238._8_8_ = 0;
    local_238._0_8_ = VECT_Z;
    pCVar12 = (this->super_ChLinkMate).super_ChLink.Body1;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = mnorm1->m_data[0];
    dVar42 = mnorm1->m_data[1];
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar36 = vfmadd231sd_fma(auVar85,auVar46,auVar36);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = mnorm1->m_data[2];
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar36 = vfmadd231sd_fma(auVar36,auVar71,auVar41);
    dVar69 = auVar36._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ =
         (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar41 = vfmadd231sd_fma(auVar97,auVar46,auVar99);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar41 = vfmadd231sd_fma(auVar41,auVar71,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar107._8_8_ = 0;
    auVar107._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar99 = vfmadd231sd_fma(auVar107,auVar46,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar99 = vfmadd231sd_fma(auVar99,auVar71,auVar3);
    auVar35 = ZEXT816(0) << 0x40;
    dVar42 = auVar41._0_8_;
    dVar43 = auVar99._0_8_;
    if (((((dVar69 != 0.0) || (NAN(dVar69))) || (dVar42 != 0.0)) ||
        ((NAN(dVar42) || (dVar43 != 0.0)))) || (NAN(dVar43))) {
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar42 * dVar42;
      auVar36 = vfmadd231sd_fma(auVar48,auVar36,auVar36);
      auVar36 = vfmadd231sd_fma(auVar36,auVar99,auVar99);
      if (auVar36._0_8_ < 0.0) {
        dVar44 = sqrt(auVar36._0_8_);
      }
      else {
        auVar36 = vsqrtsd_avx(auVar36,auVar36);
        dVar44 = auVar36._0_8_;
      }
      bVar19 = 2.2250738585072014e-308 <= dVar44;
      dVar44 = 1.0 / dVar44;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (ulong)bVar19 * (long)(dVar42 * dVar44);
      auVar34._0_8_ = (ulong)bVar19 * (long)(dVar69 * dVar44) + (ulong)!bVar19 * 0x3ff0000000000000;
      auVar34._8_8_ = 0;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = (ulong)bVar19 * (long)(dVar43 * dVar44);
    }
    else {
      auVar34 = ZEXT816(0x3ff0000000000000);
      auVar33 = ZEXT816(0) << 0x40;
    }
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar84;
    dVar44 = auVar35._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar68;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar84 * dVar44;
    auVar36 = vfmsub231sd_fma(auVar86,auVar33,auVar20);
    dVar42 = auVar36._0_8_;
    dVar121 = auVar34._0_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar121 * dVar68;
    auVar41 = vfmsub231sd_fma(auVar73,auVar35,local_238);
    dVar45 = auVar33._0_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = dVar45 * dVar95;
    auVar99 = vfmsub231sd_fma(auVar109,auVar34,auVar24);
    dVar69 = auVar99._0_8_;
    dVar43 = auVar41._0_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar43 * dVar43;
    auVar36 = vfmadd231sd_fma(auVar51,auVar36,auVar36);
    auVar36 = vfmadd231sd_fma(auVar36,auVar99,auVar99);
    if (auVar36._0_8_ < 0.0) {
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar36._0_8_;
    }
    if (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] <
        0.0001) {
      auVar13._8_8_ = 0x7fffffffffffffff;
      auVar13._0_8_ = 0x7fffffffffffffff;
      auVar36 = vandpd_avx512vl(local_238,auVar13);
      if (0.9 <= auVar36._0_8_) {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar84;
        auVar17._8_8_ = 0x7fffffffffffffff;
        auVar17._0_8_ = 0x7fffffffffffffff;
        auVar36 = vandpd_avx512vl(auVar25,auVar17);
        if (0.9 <= auVar36._0_8_) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar68;
          auVar18._8_8_ = 0x7fffffffffffffff;
          auVar18._0_8_ = 0x7fffffffffffffff;
          auVar41 = vandpd_avx512vl(auVar21,auVar18);
          auVar99 = ZEXT816(0) << 0x40;
          auVar36 = SUB6416(ZEXT864(0),0) << 0x40;
          if (0.9 <= auVar41._0_8_) goto LAB_005b2711;
          auVar36 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar36 = ZEXT816(0x3ff0000000000000);
LAB_005b2711:
          auVar99 = auVar36;
          auVar36 = ZEXT816(0);
        }
        auVar41 = ZEXT816(0) << 0x40;
      }
      else {
        auVar41 = ZEXT816(0x3ff0000000000000);
        auVar36 = ZEXT816(0);
        auVar99 = ZEXT816(0) << 0x40;
      }
      auVar89._8_8_ = 0;
      auVar89._0_8_ = auVar99._0_8_ * -dVar44;
      auVar1 = vfmadd231sd_fma(auVar89,auVar33,auVar36);
      dVar42 = auVar1._0_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = auVar36._0_8_ * -dVar121;
      auVar36 = vfmadd231sd_fma(auVar78,auVar35,auVar41);
      dVar43 = auVar36._0_8_;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = auVar41._0_8_ * -dVar45;
      auVar36 = vfmadd231sd_fma(auVar113,auVar34,auVar99);
      dVar69 = auVar36._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar43 * dVar43;
      auVar41 = vfmadd231sd_fma(auVar57,auVar1,auVar1);
      auVar36 = vfmadd231sd_fma(auVar41,auVar36,auVar36);
      if (auVar36._0_8_ < 0.0) {
        local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             sqrt(auVar36._0_8_);
      }
      else {
        auVar36 = vsqrtsd_avx(auVar36,auVar36);
        local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             auVar36._0_8_;
      }
    }
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         1.0 / local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         dVar42 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8];
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         dVar43 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8];
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         dVar69 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8];
    auVar79._8_8_ = 0;
    auVar79._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar90._8_8_ = 0;
    auVar90._0_8_ =
         dVar45 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8];
    auVar36 = vfmsub231sd_fma(auVar90,auVar79,auVar35);
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar104._8_8_ = 0;
    auVar104._0_8_ =
         dVar44 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2];
    auVar41 = vfmsub231sd_fma(auVar104,auVar58,auVar34);
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar114._8_8_ = 0;
    auVar114._0_8_ =
         dVar121 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar99 = vfmsub231sd_fma(auVar114,auVar66,auVar33);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar36._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar41._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar99._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar121
    ;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar45;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar44;
    ChFrame<double>::SetRot(&local_b8,&local_188);
    pCVar12 = (this->super_ChLinkMate).super_ChLink.Body1;
    ChTransform<double>::TransformParentToLocal
              (mpt1,&(pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    auVar120 = ZEXT816(0x3ff0000000000000);
    local_b8.coord.pos.m_data[0] = local_1a0;
    local_b8.coord.pos.m_data[1] = local_198;
    local_b8.coord.pos.m_data[2] = dStack_190;
    pCVar12 = (this->super_ChLinkMate).super_ChLink.Body2;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = mnorm2->m_data[0];
    dVar42 = mnorm2->m_data[1];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar36 = vfmadd231sd_fma(auVar91,auVar59,auVar4);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = mnorm2->m_data[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar36 = vfmadd231sd_fma(auVar36,auVar80,auVar5);
    dVar69 = auVar36._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar105._8_8_ = 0;
    auVar105._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar41 = vfmadd231sd_fma(auVar105,auVar59,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar41 = vfmadd231sd_fma(auVar41,auVar80,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar115._8_8_ = 0;
    auVar115._0_8_ =
         dVar42 * (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar99 = vfmadd231sd_fma(auVar115,auVar59,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar99 = vfmadd231sd_fma(auVar99,auVar80,auVar9);
    auVar40 = ZEXT816(0) << 0x40;
    dVar42 = auVar41._0_8_;
    dVar43 = auVar99._0_8_;
    if (((dVar69 != 0.0) || (NAN(dVar69))) || ((dVar42 != 0.0 || (NAN(dVar42))))) {
LAB_005b28df:
      auVar60._8_8_ = 0;
      auVar60._0_8_ = dVar42 * dVar42;
      auVar36 = vfmadd231sd_fma(auVar60,auVar36,auVar36);
      auVar36 = vfmadd231sd_fma(auVar36,auVar99,auVar99);
      if (auVar36._0_8_ < 0.0) {
        dVar44 = sqrt(auVar36._0_8_);
      }
      else {
        auVar36 = vsqrtsd_avx(auVar36,auVar36);
        dVar44 = auVar36._0_8_;
      }
      bVar19 = 2.2250738585072014e-308 <= dVar44;
      dVar44 = 1.0 / dVar44;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (ulong)bVar19 * (long)(dVar42 * dVar44);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = (ulong)bVar19 * (long)(dVar69 * dVar44) + (ulong)!bVar19 * 0x3ff0000000000000
      ;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = (ulong)bVar19 * (long)(dVar43 * dVar44);
    }
    else {
      auVar39 = ZEXT816(0) << 0x40;
      if ((dVar43 != 0.0) || (NAN(dVar43))) goto LAB_005b28df;
    }
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar84;
    dVar44 = auVar40._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar68;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar44 * dVar84;
    auVar36 = vfmsub231sd_fma(auVar92,auVar39,auVar22);
    dVar42 = auVar36._0_8_;
    dVar43 = auVar120._0_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar68 * dVar43;
    auVar41 = vfmsub231sd_fma(auVar81,auVar40,local_238);
    dVar121 = auVar39._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = dVar121 * dVar95;
    auVar99 = vfmsub231sd_fma(auVar116,auVar120,auVar26);
    dVar95 = auVar99._0_8_;
    dVar69 = auVar41._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar69 * dVar69;
    auVar36 = vfmadd231sd_fma(auVar61,auVar36,auVar36);
    auVar36 = vfmadd231sd_fma(auVar36,auVar99,auVar99);
    if (auVar36._0_8_ < 0.0) {
      dVar45 = sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      dVar45 = auVar36._0_8_;
    }
    if (dVar45 < 0.0001) {
      auVar14._8_8_ = 0x7fffffffffffffff;
      auVar14._0_8_ = 0x7fffffffffffffff;
      auVar36 = vandpd_avx512vl(local_238,auVar14);
      if (0.9 <= auVar36._0_8_) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar84;
        auVar15._8_8_ = 0x7fffffffffffffff;
        auVar15._0_8_ = 0x7fffffffffffffff;
        auVar36 = vandpd_avx512vl(auVar27,auVar15);
        if (0.9 <= auVar36._0_8_) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar68;
          auVar16._8_8_ = 0x7fffffffffffffff;
          auVar16._0_8_ = 0x7fffffffffffffff;
          auVar41 = vandpd_avx512vl(auVar23,auVar16);
          auVar99 = ZEXT816(0) << 0x40;
          auVar36 = SUB6416(ZEXT864(0),0) << 0x40;
          if (0.9 <= auVar41._0_8_) goto LAB_005b2aa5;
          auVar36 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar36 = ZEXT816(0x3ff0000000000000);
LAB_005b2aa5:
          auVar99 = auVar36;
          auVar36 = ZEXT816(0);
        }
        auVar41 = ZEXT816(0) << 0x40;
      }
      else {
        auVar41 = ZEXT816(0x3ff0000000000000);
        auVar36 = ZEXT816(0);
        auVar99 = ZEXT816(0) << 0x40;
      }
      auVar93._8_8_ = 0;
      auVar93._0_8_ = auVar99._0_8_ * -dVar44;
      auVar1 = vfmadd231sd_fma(auVar93,auVar39,auVar36);
      dVar42 = auVar1._0_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = auVar36._0_8_ * -dVar43;
      auVar36 = vfmadd231sd_fma(auVar82,auVar40,auVar41);
      dVar69 = auVar36._0_8_;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = auVar41._0_8_ * -dVar121;
      auVar36 = vfmadd231sd_fma(auVar117,auVar120,auVar99);
      dVar95 = auVar36._0_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = dVar69 * dVar69;
      auVar41 = vfmadd231sd_fma(auVar62,auVar1,auVar1);
      auVar36 = vfmadd231sd_fma(auVar41,auVar36,auVar36);
      if (auVar36._0_8_ < 0.0) {
        dVar45 = sqrt(auVar36._0_8_);
      }
      else {
        auVar36 = vsqrtsd_avx(auVar36,auVar36);
        dVar45 = auVar36._0_8_;
      }
    }
    dVar45 = 1.0 / dVar45;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         dVar42 * dVar45;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         dVar69 * dVar45;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         dVar95 * dVar45;
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar94._8_8_ = 0;
    auVar94._0_8_ =
         dVar121 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar36 = vfmsub231sd_fma(auVar94,auVar83,auVar40);
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar106._8_8_ = 0;
    auVar106._0_8_ =
         dVar44 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2];
    auVar41 = vfmsub231sd_fma(auVar106,auVar63,auVar120);
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         dVar43 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar99 = vfmsub231sd_fma(auVar118,auVar67,auVar39);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar36._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar41._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar99._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar43;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar121
    ;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar44;
    ChFrame<double>::SetRot(&local_140,&local_188);
    pCVar12 = (this->super_ChLinkMate).super_ChLink.Body2;
    ChTransform<double>::TransformParentToLocal
              (mpt2,&(pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    local_140.coord.pos.m_data[0] = local_1a0;
    local_140.coord.pos.m_data[1] = local_198;
    local_140.coord.pos.m_data[2] = dStack_190;
    goto LAB_005b2bed;
  }
  dVar95 = mnorm1->m_data[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar95;
  dVar84 = mnorm1->m_data[1];
  dVar68 = mnorm1->m_data[2];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar68;
  auVar32 = ZEXT816(0) << 0x40;
  if ((((dVar95 != 0.0) || (NAN(dVar95))) || (dVar84 != 0.0)) ||
     (((NAN(dVar84) || (dVar68 != 0.0)) || (NAN(dVar68))))) {
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar84 * dVar84;
    auVar36 = vfmadd231sd_fma(auVar47,auVar70,auVar70);
    auVar36 = vfmadd231sd_fma(auVar36,auVar96,auVar96);
    if (auVar36._0_8_ < 0.0) {
      dVar42 = sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      dVar42 = auVar36._0_8_;
    }
    bVar19 = 2.2250738585072014e-308 <= dVar42;
    dVar42 = 1.0 / dVar42;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (ulong)bVar19 * (long)(dVar84 * dVar42);
    auVar31._0_8_ = (ulong)bVar19 * (long)(dVar95 * dVar42) + (ulong)!bVar19 * 0x3ff0000000000000;
    auVar31._8_8_ = 0;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (ulong)bVar19 * (long)(dVar68 * dVar42);
  }
  else {
    auVar31 = ZEXT816(0x3ff0000000000000);
    auVar30 = ZEXT816(0) << 0x40;
  }
  auVar41 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar30,auVar32);
  dVar68 = auVar41._0_8_;
  dVar42 = auVar31._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar42 * -0.0;
  auVar36 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar32,auVar108);
  dVar69 = auVar30._0_8_;
  dVar95 = dVar42 + dVar69 * -0.0;
  dVar84 = auVar36._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar84 * dVar84;
  auVar36 = vfmadd231sd_fma(auVar49,auVar41,auVar41);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar95;
  auVar36 = vfmadd231sd_fma(auVar36,auVar98,auVar98);
  if (auVar36._0_8_ < 0.0) {
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         sqrt(auVar36._0_8_);
  }
  else {
    auVar36 = vsqrtsd_avx(auVar36,auVar36);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar36._0_8_;
  }
  dVar43 = auVar32._0_8_;
  if (local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] <
      0.0001) {
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar43 * -0.0;
    auVar36 = vfmadd231sd_fma(auVar72,auVar30,ZEXT816(0));
    dVar68 = auVar36._0_8_;
    dVar84 = dVar43 + dVar42 * -0.0;
    auVar41 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar31,auVar30);
    dVar95 = auVar41._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar84 * dVar84;
    auVar36 = vfmadd231sd_fma(auVar50,auVar36,auVar36);
    auVar36 = vfmadd231sd_fma(auVar36,auVar41,auVar41);
    if (auVar36._0_8_ < 0.0) {
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar36._0_8_;
    }
  }
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       1.0 / local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar68 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar84 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar95 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       dVar69 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
  auVar36 = vfmsub231sd_fma(auVar87,auVar74,auVar32);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       dVar43 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
  auVar41 = vfmsub231sd_fma(auVar100,auVar52,auVar31);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       dVar42 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar99 = vfmsub231sd_fma(auVar110,auVar64,auVar30);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar36._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar41._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar99._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar42;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar69;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar43;
  ChFrame<double>::SetRot(&local_b8,&local_188);
  if (&local_b8.coord != (ChCoordsys<double> *)mpt1) {
    local_b8.coord.pos.m_data[0] = mpt1->m_data[0];
    local_b8.coord.pos.m_data[1] = mpt1->m_data[1];
    local_b8.coord.pos.m_data[2] = mpt1->m_data[2];
  }
  dVar95 = mnorm2->m_data[0];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar95;
  dVar84 = mnorm2->m_data[1];
  dVar68 = mnorm2->m_data[2];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar68;
  auVar38 = ZEXT816(0) << 0x40;
  auVar119 = ZEXT816(0x3ff0000000000000);
  if (((dVar95 != 0.0) || (NAN(dVar95))) || ((dVar84 != 0.0 || (NAN(dVar84))))) {
LAB_005b245e:
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar84 * dVar84;
    auVar36 = vfmadd231sd_fma(auVar53,auVar75,auVar75);
    auVar36 = vfmadd231sd_fma(auVar36,auVar101,auVar101);
    if (auVar36._0_8_ < 0.0) {
      dVar42 = sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      dVar42 = auVar36._0_8_;
    }
    bVar19 = 2.2250738585072014e-308 <= dVar42;
    dVar42 = 1.0 / dVar42;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (ulong)bVar19 * (long)(dVar84 * dVar42);
    auVar119._8_8_ = 0;
    auVar119._0_8_ = (ulong)bVar19 * (long)(dVar95 * dVar42) + (ulong)!bVar19 * 0x3ff0000000000000;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = (ulong)bVar19 * (long)(dVar68 * dVar42);
  }
  else {
    auVar37 = ZEXT816(0) << 0x40;
    if ((dVar68 != 0.0) || (NAN(dVar68))) goto LAB_005b245e;
  }
  auVar41 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar37,auVar38);
  dVar68 = auVar41._0_8_;
  dVar42 = auVar119._0_8_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar42 * -0.0;
  auVar36 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar38,auVar111);
  dVar69 = auVar37._0_8_;
  dVar95 = dVar42 + dVar69 * -0.0;
  dVar84 = auVar36._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar84 * dVar84;
  auVar36 = vfmadd231sd_fma(auVar54,auVar41,auVar41);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar95;
  auVar36 = vfmadd231sd_fma(auVar36,auVar102,auVar102);
  if (auVar36._0_8_ < 0.0) {
    dVar43 = sqrt(auVar36._0_8_);
  }
  else {
    auVar36 = vsqrtsd_avx(auVar36,auVar36);
    dVar43 = auVar36._0_8_;
  }
  dVar44 = auVar38._0_8_;
  if (dVar43 < 0.0001) {
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar44 * -0.0;
    auVar36 = vfmadd231sd_fma(auVar76,auVar37,ZEXT816(0));
    dVar68 = auVar36._0_8_;
    dVar84 = dVar44 + dVar42 * -0.0;
    auVar41 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar119,auVar37);
    dVar95 = auVar41._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar84 * dVar84;
    auVar36 = vfmadd231sd_fma(auVar55,auVar36,auVar36);
    auVar36 = vfmadd231sd_fma(auVar36,auVar41,auVar41);
    if (auVar36._0_8_ < 0.0) {
      dVar43 = sqrt(auVar36._0_8_);
    }
    else {
      auVar36 = vsqrtsd_avx(auVar36,auVar36);
      dVar43 = auVar36._0_8_;
    }
  }
  dVar43 = 1.0 / dVar43;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar68 * dVar43;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar84 * dVar43;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar95 * dVar43;
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       dVar69 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
  auVar36 = vfmsub231sd_fma(auVar88,auVar77,auVar38);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       dVar44 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
  auVar41 = vfmsub231sd_fma(auVar103,auVar56,auVar119);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       dVar42 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar99 = vfmsub231sd_fma(auVar112,auVar65,auVar37);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar36._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar41._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar99._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar42;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar69;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar44;
  ChFrame<double>::SetRot(&local_140,&local_188);
  if (&local_140.coord != (ChCoordsys<double> *)mpt2) {
    local_140.coord.pos.m_data[0] = mpt2->m_data[0];
    local_140.coord.pos.m_data[1] = mpt2->m_data[1];
    local_140.coord.pos.m_data[2] = mpt2->m_data[2];
  }
LAB_005b2bed:
  ChFrame<double>::operator=(&this->frame1,&local_b8);
  ChFrame<double>::operator=(&this->frame2,&local_140);
  return;
}

Assistant:

void ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                   std::shared_ptr<ChBodyFrame> mbody2,
                                   bool pos_are_relative,
                                   ChVector<> mpt1,
                                   ChVector<> mpt2,
                                   ChVector<> mnorm1,
                                   ChVector<> mnorm2) {
    assert(mbody1.get() != mbody2.get());

    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();
    // this->SetSystem(mbody1->GetSystem());

    this->mask.SetTwoBodiesVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> mx, my, mz, mN;
    ChMatrix33<> mrot;

    ChFrame<> mfr1;
    ChFrame<> mfr2;

    if (pos_are_relative) {
        mN = mnorm1;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(mpt1);

        mN = mnorm2;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(mpt2);
    } else {
        ChVector<> temp = VECT_Z;
        // from abs to body-rel
        mN = this->Body1->TransformDirectionParentToLocal(mnorm1);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(this->Body1->TransformPointParentToLocal(mpt1));

        mN = this->Body2->TransformDirectionParentToLocal(mnorm2);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(this->Body2->TransformPointParentToLocal(mpt2));
    }

    this->frame1 = mfr1;
    this->frame2 = mfr2;
}